

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

uint32 crnd::crnd_get_segmented_file_size(void *pData,uint32 data_size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  crn_header *pcVar4;
  uint32 size;
  crn_header *pHeader;
  uint32 data_size_local;
  void *pData_local;
  
  if ((pData == (void *)0x0) || (data_size < 0x3e)) {
    pData_local._4_4_ = 0;
  }
  else {
    pcVar4 = crnd_get_header(pData,data_size);
    if (pcVar4 == (crn_header *)0x0) {
      pData_local._4_4_ = 0;
    }
    else {
      uVar1 = crn_packed_uint::operator_cast_to_unsigned_int
                        ((crn_packed_uint *)&pcVar4->m_header_size);
      uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                        ((crn_packed_uint *)&pcVar4->m_color_endpoints);
      uVar3 = crn_packed_uint::operator_cast_to_unsigned_int
                        ((crn_packed_uint *)&(pcVar4->m_color_endpoints).m_size);
      uVar1 = math::maximum<unsigned_int>(uVar1,uVar2 + uVar3);
      uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                        ((crn_packed_uint *)&pcVar4->m_color_selectors);
      uVar3 = crn_packed_uint::operator_cast_to_unsigned_int
                        ((crn_packed_uint *)&(pcVar4->m_color_selectors).m_size);
      uVar1 = math::maximum<unsigned_int>(uVar1,uVar2 + uVar3);
      uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                        ((crn_packed_uint *)&pcVar4->m_alpha_endpoints);
      uVar3 = crn_packed_uint::operator_cast_to_unsigned_int
                        ((crn_packed_uint *)&(pcVar4->m_alpha_endpoints).m_size);
      uVar1 = math::maximum<unsigned_int>(uVar1,uVar2 + uVar3);
      uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                        ((crn_packed_uint *)&pcVar4->m_alpha_selectors);
      uVar3 = crn_packed_uint::operator_cast_to_unsigned_int
                        ((crn_packed_uint *)&(pcVar4->m_alpha_selectors).m_size);
      uVar1 = math::maximum<unsigned_int>(uVar1,uVar2 + uVar3);
      uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                        ((crn_packed_uint *)&pcVar4->m_tables_ofs);
      uVar3 = crn_packed_uint::operator_cast_to_unsigned_int
                        ((crn_packed_uint *)&pcVar4->m_tables_size);
      pData_local._4_4_ = math::maximum<unsigned_int>(uVar1,uVar2 + uVar3);
    }
  }
  return pData_local._4_4_;
}

Assistant:

uint32 crnd_get_segmented_file_size(const void* pData, uint32 data_size)
    {
        if ((!pData) || (data_size < cCRNHeaderMinSize))
            return NULL;

        const crn_header* pHeader = crnd_get_header(pData, data_size);
        if (!pHeader)
            return NULL;

        uint32 size = pHeader->m_header_size;

        size = math::maximum(size, pHeader->m_color_endpoints.m_ofs + pHeader->m_color_endpoints.m_size);
        size = math::maximum(size, pHeader->m_color_selectors.m_ofs + pHeader->m_color_selectors.m_size);
        size = math::maximum(size, pHeader->m_alpha_endpoints.m_ofs + pHeader->m_alpha_endpoints.m_size);
        size = math::maximum(size, pHeader->m_alpha_selectors.m_ofs + pHeader->m_alpha_selectors.m_size);
        size = math::maximum(size, pHeader->m_tables_ofs + pHeader->m_tables_size);

        return size;
    }